

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

void __thiscall
rsg::ConditionalStatement::execute(ConditionalStatement *this,ExecutionContext *execCtx)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  bool *pbVar3;
  int local_26c;
  undefined1 auStack_268 [4];
  int i;
  ExecValueAccess falseMask;
  ExecMaskStorage tmp;
  ConstStridedValueAccess<64> local_148;
  StridedValueRead<64> local_138;
  undefined1 local_128 [8];
  ExecValueAccess trueMask;
  ExecMaskStorage maskStorage;
  ExecutionContext *execCtx_local;
  ConditionalStatement *this_local;
  
  (*this->m_condition->_vptr_Expression[4])(this->m_condition,execCtx);
  ExecMaskStorage::ExecMaskStorage
            ((ExecMaskStorage *)&trueMask.super_ConstStridedValueAccess<64>.m_value,true);
  _local_128 = (ConstStridedValueAccess<64>)
               ExecMaskStorage::getValue
                         ((ExecMaskStorage *)&trueMask.super_ConstStridedValueAccess<64>.m_value);
  iVar2 = (*this->m_condition->_vptr_Expression[5])();
  local_148.m_type = (VariableType *)CONCAT44(extraout_var,iVar2);
  local_138 = ConstStridedValueAccess<64>::value(&local_148);
  StridedValueAccess<64>::operator=((StridedValueAccess<64> *)local_128,&local_138);
  ExecutionContext::andExecutionMask(execCtx,_local_128);
  (*this->m_trueStatement->_vptr_Statement[4])(this->m_trueStatement,execCtx);
  ExecutionContext::popExecutionMask(execCtx);
  if (this->m_falseStatement != (Statement *)0x0) {
    ExecMaskStorage::ExecMaskStorage
              ((ExecMaskStorage *)&falseMask.super_ConstStridedValueAccess<64>.m_value,true);
    _auStack_268 = (ExecConstValueAccess)
                   ExecMaskStorage::getValue
                             ((ExecMaskStorage *)
                              &falseMask.super_ConstStridedValueAccess<64>.m_value);
    for (local_26c = 0; local_26c < 0x40; local_26c = local_26c + 1) {
      pbVar3 = StridedValueAccess<64>::asBool((StridedValueAccess<64> *)local_128,local_26c);
      bVar1 = *pbVar3;
      pbVar3 = StridedValueAccess<64>::asBool((StridedValueAccess<64> *)auStack_268,local_26c);
      *pbVar3 = (bool)((bVar1 ^ 0xffU) & 1);
    }
    ExecutionContext::andExecutionMask(execCtx,_auStack_268);
    (*this->m_falseStatement->_vptr_Statement[4])(this->m_falseStatement,execCtx);
    ExecutionContext::popExecutionMask(execCtx);
  }
  return;
}

Assistant:

void ConditionalStatement::execute (ExecutionContext& execCtx) const
{
	// Evaluate condition
	m_condition->evaluate(execCtx);

	ExecMaskStorage	maskStorage; // Value might change when we are evaluating true block so we have to take a copy.
	ExecValueAccess	trueMask	= maskStorage.getValue();

	trueMask = m_condition->getValue().value();

	// And mask, execute true statement and pop
	execCtx.andExecutionMask(trueMask);
	m_trueStatement->execute(execCtx);
	execCtx.popExecutionMask();

	if (m_falseStatement)
	{
		// Construct negated mask, execute false statement and pop
		ExecMaskStorage tmp;
		ExecValueAccess	falseMask = tmp.getValue();

		for (int i = 0; i < EXEC_VEC_WIDTH; i++)
			falseMask.asBool(i) = !trueMask.asBool(i);

		execCtx.andExecutionMask(falseMask);
		m_falseStatement->execute(execCtx);
		execCtx.popExecutionMask();
	}
}